

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_connection.c
# Opt level: O0

ngx_int_t ngx_clone_listening(ngx_conf_t *cf,ngx_listening_t *ls)

{
  void *__dest;
  undefined1 local_110 [8];
  ngx_listening_t ols;
  ngx_core_conf_t *ccf;
  ngx_int_t n;
  ngx_listening_t *ls_local;
  ngx_conf_t *cf_local;
  
  if ((*(uint *)&ls->field_0xd8 >> 0xc & 1) != 0) {
    memcpy(local_110,ls,0xe0);
    ols._216_8_ = cf->cycle->conf_ctx[ngx_core_module.index];
    for (ccf = (ngx_core_conf_t *)&DAT_00000001; (long)ccf < *(long *)(ols._216_8_ + 0x20);
        ccf = (ngx_core_conf_t *)((long)&ccf->daemon + 1)) {
      __dest = ngx_array_push(&cf->cycle->listening);
      if (__dest == (void *)0x0) {
        return -1;
      }
      memcpy(__dest,local_110,0xe0);
      *(ngx_core_conf_t **)((long)__dest + 0xd0) = ccf;
    }
  }
  return 0;
}

Assistant:

ngx_int_t
ngx_clone_listening(ngx_conf_t *cf, ngx_listening_t *ls)
{
#if (NGX_HAVE_REUSEPORT)

    ngx_int_t         n;
    ngx_core_conf_t  *ccf;
    ngx_listening_t   ols;

    if (!ls->reuseport) {
        return NGX_OK;
    }

    ols = *ls;

    ccf = (ngx_core_conf_t *) ngx_get_conf(cf->cycle->conf_ctx,
                                           ngx_core_module);

    for (n = 1; n < ccf->worker_processes; n++) {

        /* create a socket for each worker process */

        ls = ngx_array_push(&cf->cycle->listening);
        if (ls == NULL) {
            return NGX_ERROR;
        }

        *ls = ols;
        ls->worker = n;
    }

#endif

    return NGX_OK;
}